

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Step(Vdbe *p)

{
  sqlite3 *db_00;
  int iVar1;
  uint local_24;
  int rc;
  sqlite3 *db;
  Vdbe *p_local;
  
  db_00 = p->db;
  if (p->eVdbeState != '\x02') {
    while (p->eVdbeState != '\x01') {
      if (p->eVdbeState != '\x03') goto LAB_001bd505;
      sqlite3_reset((sqlite3_stmt *)p);
    }
    if ((p->field_0xc6 & 3) != 0) {
      p->rc = 0x11;
      local_24 = 1;
      if ((p->prepFlags & 0x80) != 0) {
        local_24 = sqlite3VdbeTransferError(p);
      }
      goto LAB_001bd64d;
    }
    if (db_00->nVdbeActive == 0) {
      (db_00->u1).isInterrupted = 0;
    }
    if ((((db_00->mTrace & 0x82) != 0) && ((db_00->init).busy == '\0')) && (p->zSql != (char *)0x0))
    {
      sqlite3OsCurrentTimeInt64(db_00->pVfs,&p->startTime);
    }
    db_00->nVdbeActive = db_00->nVdbeActive + 1;
    if (((byte)p->field_0xc6 >> 6 & 1) == 0) {
      db_00->nVdbeWrite = db_00->nVdbeWrite + 1;
    }
    if ((char)p->field_0xc6 < '\0') {
      db_00->nVdbeRead = db_00->nVdbeRead + 1;
    }
    p->pc = 0;
    p->eVdbeState = '\x02';
  }
LAB_001bd505:
  if (((byte)p->field_0xc6 >> 2 & 3) == 0) {
    db_00->nVdbeExec = db_00->nVdbeExec + 1;
    local_24 = sqlite3VdbeExec(p);
    db_00->nVdbeExec = db_00->nVdbeExec + -1;
  }
  else {
    local_24 = sqlite3VdbeList(p);
  }
  if (local_24 == 100) {
    db_00->errCode = 100;
    return 100;
  }
  if (0 < p->startTime) {
    invokeProfileCallback(db_00,p);
  }
  if ((local_24 == 0x65) && (db_00->autoCommit != '\0')) {
    iVar1 = doWalCallbacks(db_00);
    p->rc = iVar1;
    if (p->rc != 0) {
      local_24 = 1;
    }
  }
  else if ((local_24 != 0x65) && ((p->prepFlags & 0x80) != 0)) {
    local_24 = sqlite3VdbeTransferError(p);
  }
  db_00->errCode = local_24;
  iVar1 = sqlite3ApiExit(p->db,p->rc);
  if ((iVar1 == 7) && (p->rc = 7, (p->prepFlags & 0x80) != 0)) {
    local_24 = p->rc;
  }
LAB_001bd64d:
  return local_24 & db_00->errMask;
}

Assistant:

static int sqlite3Step(Vdbe *p){
  sqlite3 *db;
  int rc;

  assert(p);
  db = p->db;
  if( p->eVdbeState!=VDBE_RUN_STATE ){
    restart_step:
    if( p->eVdbeState==VDBE_READY_STATE ){
      if( p->expired ){
        p->rc = SQLITE_SCHEMA;
        rc = SQLITE_ERROR;
        if( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 ){
          /* If this statement was prepared using saved SQL and an
          ** error has occurred, then return the error code in p->rc to the
          ** caller. Set the error code in the database handle to the same
          ** value.
          */
          rc = sqlite3VdbeTransferError(p);
        }
        goto end_of_step;
      }

      /* If there are no other statements currently running, then
      ** reset the interrupt flag.  This prevents a call to sqlite3_interrupt
      ** from interrupting a statement that has not yet started.
      */
      if( db->nVdbeActive==0 ){
        AtomicStore(&db->u1.isInterrupted, 0);
      }

      assert( db->nVdbeWrite>0 || db->autoCommit==0
          || (db->nDeferredCons==0 && db->nDeferredImmCons==0)
      );

#ifndef SQLITE_OMIT_TRACE
      if( (db->mTrace & (SQLITE_TRACE_PROFILE|SQLITE_TRACE_XPROFILE))!=0
          && !db->init.busy && p->zSql ){
        sqlite3OsCurrentTimeInt64(db->pVfs, &p->startTime);
      }else{
        assert( p->startTime==0 );
      }
#endif

      db->nVdbeActive++;
      if( p->readOnly==0 ) db->nVdbeWrite++;
      if( p->bIsReader ) db->nVdbeRead++;
      p->pc = 0;
      p->eVdbeState = VDBE_RUN_STATE;
    }else

    if( ALWAYS(p->eVdbeState==VDBE_HALT_STATE) ){
      /* We used to require that sqlite3_reset() be called before retrying
      ** sqlite3_step() after any error or after SQLITE_DONE.  But beginning
      ** with version 3.7.0, we changed this so that sqlite3_reset() would
      ** be called automatically instead of throwing the SQLITE_MISUSE error.
      ** This "automatic-reset" change is not technically an incompatibility,
      ** since any application that receives an SQLITE_MISUSE is broken by
      ** definition.
      **
      ** Nevertheless, some published applications that were originally written
      ** for version 3.6.23 or earlier do in fact depend on SQLITE_MISUSE
      ** returns, and those were broken by the automatic-reset change.  As a
      ** a work-around, the SQLITE_OMIT_AUTORESET compile-time restores the
      ** legacy behavior of returning SQLITE_MISUSE for cases where the
      ** previous sqlite3_step() returned something other than a SQLITE_LOCKED
      ** or SQLITE_BUSY error.
      */
#ifdef SQLITE_OMIT_AUTORESET
      if( (rc = p->rc&0xff)==SQLITE_BUSY || rc==SQLITE_LOCKED ){
        sqlite3_reset((sqlite3_stmt*)p);
      }else{
        return SQLITE_MISUSE_BKPT;
      }
#else
      sqlite3_reset((sqlite3_stmt*)p);
#endif
      assert( p->eVdbeState==VDBE_READY_STATE );
      goto restart_step;
    }
  }

#ifdef SQLITE_DEBUG
  p->rcApp = SQLITE_OK;
#endif
#ifndef SQLITE_OMIT_EXPLAIN
  if( p->explain ){
    rc = sqlite3VdbeList(p);
  }else
#endif /* SQLITE_OMIT_EXPLAIN */
  {
    db->nVdbeExec++;
    rc = sqlite3VdbeExec(p);
    db->nVdbeExec--;
  }

  if( rc==SQLITE_ROW ){
    assert( p->rc==SQLITE_OK );
    assert( db->mallocFailed==0 );
    db->errCode = SQLITE_ROW;
    return SQLITE_ROW;
  }else{
#ifndef SQLITE_OMIT_TRACE
    /* If the statement completed successfully, invoke the profile callback */
    checkProfileCallback(db, p);
#endif

    if( rc==SQLITE_DONE && db->autoCommit ){
      assert( p->rc==SQLITE_OK );
      p->rc = doWalCallbacks(db);
      if( p->rc!=SQLITE_OK ){
        rc = SQLITE_ERROR;
      }
    }else if( rc!=SQLITE_DONE && (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 ){
      /* If this statement was prepared using saved SQL and an
      ** error has occurred, then return the error code in p->rc to the
      ** caller. Set the error code in the database handle to the same value.
      */
      rc = sqlite3VdbeTransferError(p);
    }
  }

  db->errCode = rc;
  if( SQLITE_NOMEM==sqlite3ApiExit(p->db, p->rc) ){
    p->rc = SQLITE_NOMEM_BKPT;
    if( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 ) rc = p->rc;
  }
end_of_step:
  /* There are only a limited number of result codes allowed from the
  ** statements prepared using the legacy sqlite3_prepare() interface */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0
       || rc==SQLITE_ROW  || rc==SQLITE_DONE   || rc==SQLITE_ERROR
       || (rc&0xff)==SQLITE_BUSY || rc==SQLITE_MISUSE
  );
  return (rc&db->errMask);
}